

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O3

string * google::protobuf::compiler::objectivec::anon_unknown_0::SanitizeNameForObjC
                   (string *__return_storage_ptr__,string_view prefix,string_view input,
                   string_view extension,string *out_suffix_added)

{
  char cVar1;
  int iVar2;
  string *extraout_RAX;
  string *psVar3;
  long *plVar4;
  char *__s2;
  char *__n;
  anon_class_1_0_00000001 *this;
  anon_class_1_0_00000001 *this_00;
  char *__s1;
  iterator iVar5;
  undefined1 local_d0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  long local_a0 [2];
  AlphaNum local_90;
  string *local_60;
  char *local_58;
  
  __s1 = input._M_str;
  plVar4 = (long *)input._M_len;
  __s2 = prefix._M_str;
  __n = (char *)prefix._M_len;
  local_d0._0_8_ = local_d0 + 0x10;
  local_d0._8_8_ = (string *)0x0;
  local_d0[0x10] = '\0';
  local_90.piece_._M_len = (size_t)__n;
  if ((__n == (char *)0x0) || ((__n <= plVar4 && (iVar2 = bcmp(__s1,__s2,(size_t)__n), iVar2 == 0)))
     ) {
    if ((plVar4 == (long *)__n) || (0x19 < (byte)(__s1[(long)__n] + 0xbfU))) {
      local_90.piece_._M_str = __s2;
      local_60 = (string *)plVar4;
      local_58 = __s1;
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)&local_b0,&local_90);
      goto LAB_002deeee;
    }
    local_90.piece_._M_len = (size_t)local_90.digits_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,__s1,(char *)((long)plVar4 + (long)__s1));
    std::__cxx11::string::operator=((string *)local_d0,(string *)&local_90);
    local_a0[0] = local_90.digits_._0_8_;
    local_b0._M_allocated_capacity = local_90.piece_._M_len;
    if ((char *)local_90.piece_._M_len == local_90.digits_) goto LAB_002def1a;
  }
  else {
    local_90.piece_._M_str = __s2;
    local_60 = (string *)plVar4;
    local_58 = __s1;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)&local_b0,&local_90);
LAB_002deeee:
    std::__cxx11::string::operator=((string *)local_d0,(string *)local_b0._M_local_buf);
    if ((long *)local_b0._M_allocated_capacity == local_a0) goto LAB_002def1a;
  }
  operator_delete((void *)local_b0._M_allocated_capacity,local_a0[0] + 1);
LAB_002def1a:
  if ((((ulong)local_d0._8_8_ < (string *)0x3) || (*(char *)local_d0._0_8_ != '_')) ||
     ((cVar1 = *(char *)(local_d0._0_8_ + 1), iVar2 = isupper((int)cVar1), cVar1 != 0x5f &&
      (iVar2 == 0)))) {
    if ((anonymous_namespace)::ReservedWords()::words == '\0') {
      this = (anon_class_1_0_00000001 *)&(anonymous_namespace)::ReservedWords()::words;
      iVar2 = __cxa_guard_acquire();
      if (iVar2 != 0) {
        (anonymous_namespace)::ReservedWords()::words =
             (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              *)ReservedWords::anon_class_1_0_00000001::operator()(this);
        __cxa_guard_release(&(anonymous_namespace)::ReservedWords()::words);
      }
    }
    iVar5 = absl::lts_20240722::container_internal::
            raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
            ::find<std::__cxx11::string>
                      ((anonymous_namespace)::ReservedWords()::words,
                       (key_arg<std::__cxx11::basic_string<char>_> *)local_d0);
    if (iVar5.ctrl_ == (ctrl_t *)0x0) {
      if ((anonymous_namespace)::NSObjectMethods()::words == '\0') {
        this_00 = (anon_class_1_0_00000001 *)&(anonymous_namespace)::NSObjectMethods()::words;
        iVar2 = __cxa_guard_acquire();
        if (iVar2 != 0) {
          (anonymous_namespace)::NSObjectMethods()::words =
               (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)NSObjectMethods::anon_class_1_0_00000001::operator()(this_00);
          __cxa_guard_release(&(anonymous_namespace)::NSObjectMethods()::words);
        }
      }
      iVar5 = absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              ::find<std::__cxx11::string>
                        ((anonymous_namespace)::NSObjectMethods()::words,
                         (key_arg<std::__cxx11::basic_string<char>_> *)local_d0);
      if (iVar5.ctrl_ == (ctrl_t *)0x0) {
        if (extension._M_str != (char *)0x0) {
          extension._M_str[8] = '\0';
          extension._M_str[9] = '\0';
          extension._M_str[10] = '\0';
          extension._M_str[0xb] = '\0';
          extension._M_str[0xc] = '\0';
          extension._M_str[0xd] = '\0';
          extension._M_str[0xe] = '\0';
          extension._M_str[0xf] = '\0';
          **(undefined1 **)extension._M_str = 0;
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((string *)local_d0._0_8_ == (string *)(local_d0 + 0x10)) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(local_d0._17_7_,local_d0[0x10]);
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_d0._24_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_d0._0_8_;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(local_d0._17_7_,local_d0[0x10]);
        }
        __return_storage_ptr__->_M_string_length = local_d0._8_8_;
        return (string *)local_d0._8_8_;
      }
    }
  }
  if (extension._M_str != (char *)0x0) {
    local_90.piece_._M_len = (size_t)local_90.digits_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,extension._M_len,
               (long)&(out_suffix_added->_M_dataplus)._M_p + extension._M_len);
    std::__cxx11::string::operator=((string *)extension._M_str,(string *)&local_90);
    if ((char *)local_90.piece_._M_len != local_90.digits_) {
      operator_delete((void *)local_90.piece_._M_len,local_90.digits_._0_8_ + 1);
    }
  }
  local_90.piece_._M_len = local_d0._8_8_;
  local_90.piece_._M_str = (char *)local_d0._0_8_;
  local_58 = (char *)extension._M_len;
  local_60 = out_suffix_added;
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_90);
  psVar3 = (string *)(local_d0 + 0x10);
  if ((string *)local_d0._0_8_ != psVar3) {
    operator_delete((void *)local_d0._0_8_,CONCAT71(local_d0._17_7_,local_d0[0x10]) + 1);
    psVar3 = extraout_RAX;
  }
  return psVar3;
}

Assistant:

std::string SanitizeNameForObjC(absl::string_view prefix,
                                absl::string_view input,
                                absl::string_view extension,
                                std::string* out_suffix_added) {
  std::string sanitized;
  // We add the prefix in the cases where the string is missing a prefix.
  // We define "missing a prefix" as where 'input':
  // a) Doesn't start with the prefix or
  // b) Isn't equivalent to the prefix or
  // c) Has the prefix, but the letter after the prefix is lowercase
  if (absl::StartsWith(input, prefix)) {
    if (input.length() == prefix.length() ||
        !absl::ascii_isupper(input[prefix.length()])) {
      sanitized = absl::StrCat(prefix, input);
    } else {
      sanitized = std::string(input);
    }
  } else {
    sanitized = absl::StrCat(prefix, input);
  }
  if (IsReservedCIdentifier(sanitized) || ReservedWords().contains(sanitized) ||
      NSObjectMethods().contains(sanitized)) {
    if (out_suffix_added) *out_suffix_added = std::string(extension);
    return absl::StrCat(sanitized, extension);
  }
  if (out_suffix_added) out_suffix_added->clear();
  return sanitized;
}